

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<void_*> * __thiscall
kj::ArrayBuilder<void_*>::operator=(ArrayBuilder<void_*> *this,ArrayBuilder<void_*> *other)

{
  RemoveConst<void_*> *ppvVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  ppvVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppvVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (void **)0x0;
  other->pos = (RemoveConst<void_*> *)0x0;
  other->endPtr = (void **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }